

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test2::prepareUniformTypes(GPUShaderFP64Test2 *this)

{
  uniformTypeDetails local_290;
  uniformTypeDetails local_260;
  uniformTypeDetails local_230;
  uniformTypeDetails local_200;
  uniformTypeDetails local_1d0;
  uniformTypeDetails local_1a0;
  uniformTypeDetails local_170;
  uniformTypeDetails local_140;
  uniformTypeDetails local_110;
  uniformTypeDetails local_e0;
  uniformTypeDetails local_b0;
  uniformTypeDetails local_80;
  uniformTypeDetails local_40;
  GPUShaderFP64Test2 *local_10;
  GPUShaderFP64Test2 *this_local;
  
  local_10 = this;
  uniformTypeDetails::uniformTypeDetails(&local_40,1,1);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_40);
  uniformTypeDetails::~uniformTypeDetails(&local_40);
  uniformTypeDetails::uniformTypeDetails(&local_80,1,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_80);
  uniformTypeDetails::~uniformTypeDetails(&local_80);
  uniformTypeDetails::uniformTypeDetails(&local_b0,1,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_b0);
  uniformTypeDetails::~uniformTypeDetails(&local_b0);
  uniformTypeDetails::uniformTypeDetails(&local_e0,1,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_e0);
  uniformTypeDetails::~uniformTypeDetails(&local_e0);
  uniformTypeDetails::uniformTypeDetails(&local_110,2,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_110);
  uniformTypeDetails::~uniformTypeDetails(&local_110);
  uniformTypeDetails::uniformTypeDetails(&local_140,2,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_140);
  uniformTypeDetails::~uniformTypeDetails(&local_140);
  uniformTypeDetails::uniformTypeDetails(&local_170,2,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_170);
  uniformTypeDetails::~uniformTypeDetails(&local_170);
  uniformTypeDetails::uniformTypeDetails(&local_1a0,3,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_1a0);
  uniformTypeDetails::~uniformTypeDetails(&local_1a0);
  uniformTypeDetails::uniformTypeDetails(&local_1d0,3,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_1d0);
  uniformTypeDetails::~uniformTypeDetails(&local_1d0);
  uniformTypeDetails::uniformTypeDetails(&local_200,3,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_200);
  uniformTypeDetails::~uniformTypeDetails(&local_200);
  uniformTypeDetails::uniformTypeDetails(&local_230,4,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_230);
  uniformTypeDetails::~uniformTypeDetails(&local_230);
  uniformTypeDetails::uniformTypeDetails(&local_260,4,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_260);
  uniformTypeDetails::~uniformTypeDetails(&local_260);
  uniformTypeDetails::uniformTypeDetails(&local_290,4,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::push_back(&this->m_uniform_types,&local_290);
  uniformTypeDetails::~uniformTypeDetails(&local_290);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformTypes()
{
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 1 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 4 /* n_rows */));
}